

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

uintm __thiscall
ParserContext::getInstructionBytes(ParserContext *this,int4 bytestart,int4 size,uint4 off)

{
  BadDataError *this_00;
  int local_68;
  uint local_64;
  int4 i;
  uintm res;
  uint1 *ptr;
  allocator local_41;
  string local_40 [36];
  uint local_1c;
  int4 local_18;
  uint4 off_local;
  int4 size_local;
  int4 bytestart_local;
  ParserContext *this_local;
  
  local_1c = bytestart + off;
  if (0xf < local_1c) {
    local_18 = size;
    off_local = bytestart;
    _size_local = this;
    this_00 = (BadDataError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Instruction is using more than 16 bytes",&local_41);
    BadDataError::BadDataError(this_00,(string *)local_40);
    __cxa_throw(this_00,&BadDataError::typeinfo,BadDataError::~BadDataError);
  }
  local_64 = 0;
  for (local_68 = 0; local_68 < size; local_68 = local_68 + 1) {
    local_64 = (uint)this->buf[(long)local_68 + (ulong)local_1c] | local_64 << 8;
  }
  return local_64;
}

Assistant:

uintm ParserContext::getInstructionBytes(int4 bytestart,int4 size,uint4 off) const

{				// Get bytes from the instruction stream into a intm
				// (assuming big endian format)
  off += bytestart;
  if (off >=16)
    throw BadDataError("Instruction is using more than 16 bytes"); 
  const uint1 *ptr = buf + off;
  uintm res = 0;
  for(int4 i=0;i<size;++i) {
    res <<= 8;
    res |= ptr[i];
  }
  return res;
}